

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_IDAT(ucvector *out,uchar *data,size_t datasize,LodePNGCompressSettings *zlibsettings)

{
  uint local_44;
  undefined1 auStack_40 [4];
  uint error;
  ucvector zlibdata;
  LodePNGCompressSettings *zlibsettings_local;
  size_t datasize_local;
  uchar *data_local;
  ucvector *out_local;
  
  zlibdata.allocsize = (size_t)zlibsettings;
  ucvector_init((ucvector *)auStack_40);
  local_44 = zlib_compress((uchar **)auStack_40,(size_t *)&zlibdata,data,datasize,
                           (LodePNGCompressSettings *)zlibdata.allocsize);
  if (local_44 == 0) {
    local_44 = addChunk(out,"IDAT",_auStack_40,(size_t)zlibdata.data);
  }
  ucvector_cleanup(auStack_40);
  return local_44;
}

Assistant:

static unsigned addChunk_IDAT(ucvector* out, const unsigned char* data, size_t datasize,
                              LodePNGCompressSettings* zlibsettings)
{
  ucvector zlibdata;
  unsigned error = 0;

  /*compress with the Zlib compressor*/
  ucvector_init(&zlibdata);
  error = zlib_compress(&zlibdata.data, &zlibdata.size, data, datasize, zlibsettings);
  if(!error) error = addChunk(out, "IDAT", zlibdata.data, zlibdata.size);
  ucvector_cleanup(&zlibdata);

  return error;
}